

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void AccumulateRGB(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int rgb_stride,
                  uint16_t *dst,int width)

{
  int iVar1;
  uint32_t shift;
  uint32_t base_value;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined2 *in_R9;
  uint in_stack_00000008;
  int j;
  int i;
  int in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  int local_30;
  int local_2c;
  undefined2 *local_28;
  
  local_30 = 0;
  local_28 = in_R9;
  for (local_2c = 0; local_2c < (int)in_stack_00000008 >> 1; local_2c = local_2c + 1) {
    GammaToLinear(*(uint8_t *)(in_RDI + local_30));
    GammaToLinear(*(uint8_t *)(in_RDI + local_30 + (long)in_ECX));
    GammaToLinear(*(uint8_t *)(in_RDI + local_30 + (long)in_R8D));
    GammaToLinear(*(uint8_t *)(in_RDI + local_30 + (long)(in_R8D + in_ECX)));
    iVar1 = LinearToGamma(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    *local_28 = (short)iVar1;
    GammaToLinear(*(uint8_t *)(in_RSI + local_30));
    GammaToLinear(*(uint8_t *)(in_RSI + local_30 + (long)in_ECX));
    GammaToLinear(*(uint8_t *)(in_RSI + local_30 + (long)in_R8D));
    GammaToLinear(*(uint8_t *)(in_RSI + local_30 + (long)(in_R8D + in_ECX)));
    iVar1 = LinearToGamma(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    local_28[1] = (short)iVar1;
    GammaToLinear(*(uint8_t *)(in_RDX + local_30));
    GammaToLinear(*(uint8_t *)(in_RDX + local_30 + (long)in_ECX));
    GammaToLinear(*(uint8_t *)(in_RDX + local_30 + (long)in_R8D));
    GammaToLinear(*(uint8_t *)(in_RDX + local_30 + (long)(in_R8D + in_ECX)));
    iVar1 = LinearToGamma(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    local_28[2] = (short)iVar1;
    local_30 = in_ECX * 2 + local_30;
    local_28 = local_28 + 4;
  }
  if ((in_stack_00000008 & 1) != 0) {
    shift = GammaToLinear(*(uint8_t *)(in_RDI + local_30));
    GammaToLinear(*(uint8_t *)(in_RDI + local_30 + (long)in_R8D));
    iVar1 = LinearToGamma(in_stack_ffffffffffffffa4,shift);
    *local_28 = (short)iVar1;
    base_value = GammaToLinear(*(uint8_t *)(in_RSI + local_30));
    GammaToLinear(*(uint8_t *)(in_RSI + local_30 + (long)in_R8D));
    iVar1 = LinearToGamma(base_value,shift);
    local_28[1] = (short)iVar1;
    GammaToLinear(*(uint8_t *)(in_RDX + local_30));
    GammaToLinear(*(uint8_t *)(in_RDX + local_30 + (long)in_R8D));
    iVar1 = LinearToGamma(base_value,shift);
    local_28[2] = (short)iVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGB(const uint8_t* const r_ptr,
                                      const uint8_t* const g_ptr,
                                      const uint8_t* const b_ptr,
                                      int step, int rgb_stride,
                                      uint16_t* dst, int width) {
  int i, j;
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * step, dst += 4) {
    dst[0] = SUM4(r_ptr + j, step);
    dst[1] = SUM4(g_ptr + j, step);
    dst[2] = SUM4(b_ptr + j, step);
  }
  if (width & 1) {
    dst[0] = SUM2(r_ptr + j);
    dst[1] = SUM2(g_ptr + j);
    dst[2] = SUM2(b_ptr + j);
  }
}